

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrays.h
# Opt level: O0

void __thiscall
glslang::TSmallArrayVector::push_back(TSmallArrayVector *this,uint e,TIntermTyped *n)

{
  undefined1 local_30 [8];
  TArraySize pair;
  TIntermTyped *n_local;
  uint e_local;
  TSmallArrayVector *this_local;
  
  pair.node = n;
  alloc(this);
  pair._0_8_ = pair.node;
  local_30._0_4_ = e;
  std::vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>::push_back
            (&this->sizes->
              super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>,
             (value_type *)local_30);
  return;
}

Assistant:

void push_back(unsigned int e, TIntermTyped* n)
    {
        alloc();
        TArraySize pair = { e, n };
        sizes->push_back(pair);
    }